

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O2

bool __thiscall pbrt::anon_unknown_4::initArg(anon_unknown_4 *this,string *str,span<int> out)

{
  size_t __n;
  string_view str_00;
  vector<int,_std::allocator<int>_> v;
  
  str_00._M_str = *(char **)this;
  str_00._M_len = *(size_t *)(this + 8);
  SplitStringToInts(&v,str_00,',');
  __n = (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
  if ((int *)((long)__n >> 2) == out.ptr && __n != 0) {
    memmove(str,v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start,__n);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return (int *)((long)__n >> 2) == out.ptr;
}

Assistant:

bool initArg(const std::string &str, pstd::span<int> out) {
    std::vector<int> v = SplitStringToInts(str, ',');
    if (v.size() != out.size())
        return false;
    std::copy(v.begin(), v.end(), out.begin());
    return true;
}